

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

object * find(void)

{
  long lVar1;
  object *poVar2;
  object *poVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  object *poVar7;
  object *poVar8;
  
  poVar2 = guard;
  poVar8 = topScope;
  uVar6 = 0xffffffffffffffff;
  do {
    lVar1 = uVar6 + 1;
    uVar6 = uVar6 + 1;
  } while (idName[lVar1] != '\0');
  if (uVar6 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 1;
    if (1 < (int)uVar6) {
      uVar5 = uVar6 & 0xffffffff;
    }
    uVar6 = 0;
    do {
      poVar2->name[uVar6] = idName[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  poVar2->name[uVar5] = '\0';
  poVar3 = universe;
  poVar2 = guard;
  while( true ) {
    poVar7 = poVar8->next;
    while (iVar4 = stringCompare(poVar7->name,idName), iVar4 != 0) {
      poVar7 = poVar7->next;
    }
    if ((poVar7 == poVar2) && (poVar8 == poVar3)) break;
    poVar8 = poVar8->dsc;
    if (poVar7 != poVar2) {
      return poVar7;
    }
  }
  mark("undef");
  exit(-1);
}

Assistant:

object * find (void) {
	variable bool cond;
	variable int ret;
	variable struct object *s; variable struct object *x; variable struct object *obj;
	s = NULL; x = NULL;	obj = NULL; ret = -1; cond = true;
	s = topScope;

	/* copy idname to guard */
	stringCopy(idName,guard->name); 
	while (cond == true){ 
		x = s->next; 
		ret = stringCompare(x->name,idName);	
		while (ret != 0) { /* iterate over objects in currentLevel, while names are different */
			x = x->next; 
			ret = stringCompare(x->name,idName);
		}

		/* did we find the guard */
		if (x != guard) { 
			obj = x;
			cond = false;
		}
		
		/* if we reach the universe and nothing was found --> error */
		if ((s == universe) && (cond == true)) { 
			obj = x;
			mark("undef");
			exit(-1);
		}
		s = s->dsc; /* step up one level */
	}
	return obj;
}